

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-timed.c
# Opt level: O1

_Bool player_timed_grade_eq(player *p,wchar_t idx,char *match)

{
  timed_grade *ptVar1;
  int iVar2;
  timed_grade **pptVar3;
  
  if (p->timed[idx] != 0) {
    pptVar3 = &timed_effects[idx].grade;
    do {
      ptVar1 = *pptVar3;
      pptVar3 = &ptVar1->next;
    } while (ptVar1->max < (int)p->timed[idx]);
    if ((ptVar1->name != (char *)0x0) && (iVar2 = strcmp(ptVar1->name,match), iVar2 == 0)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool player_timed_grade_eq(struct player *p, int idx, const char *match)
{
	if (p->timed[idx]) {
		struct timed_grade *grade = timed_effects[idx].grade;
		while (p->timed[idx] > grade->max) {
			grade = grade->next;
		}
		if (grade->name && streq(grade->name, match)) return true;
	}

	return false;
}